

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::StuntDouble::getTrq(Vector3d *__return_storage_ptr__,StuntDouble *this)

{
  Vector<double,_3U>::Vector
            (&__return_storage_ptr__->super_Vector<double,_3U>,
             (Vector<double,_3U> *)
             ((long)this->localIndex_ * 0x18 +
             *(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).torque.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + this->storage_)));
  return __return_storage_ptr__;
}

Assistant:

Vector3d getTrq() {
      return ((snapshotMan_->getCurrentSnapshot())->*storage_)
          .torque[localIndex_];
    }